

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O3

void DrawOneWeapon(player_t *CPlayer,int x,int *y,AWeapon *weapon)

{
  AWeapon *pAVar1;
  FTexture *tex;
  int iVar2;
  FTextureID FVar3;
  PClass *pPVar4;
  undefined4 extraout_var;
  AWeapon *pAVar6;
  int y_00;
  int h;
  bool bVar7;
  PClass *pPVar5;
  
  if (((weapon->super_AInventory).field_0x4dd & 4) != 0) {
    return;
  }
  pAVar1 = (weapon->SisterWeapon).field_0.p;
  if (pAVar1 != (AWeapon *)0x0) {
    if (((pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) ==
        0) {
      pPVar4 = (pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
      if (pPVar4 == (PClass *)0x0) {
        pPVar4 = (PClass *)
                 (**(pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.
                    _vptr_DObject)(pAVar1);
        (pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar4;
      }
      pPVar5 = (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar2 = (**(weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.
                   _vptr_DObject)(weapon);
        pPVar5 = (PClass *)CONCAT44(extraout_var,iVar2);
        (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar5;
      }
      bVar7 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar4 && bVar7) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar7 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar4) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (bVar7) {
        return;
      }
    }
    else {
      (weapon->SisterWeapon).field_0.p = (AWeapon *)0x0;
    }
  }
  pAVar1 = CPlayer->ReadyWeapon;
  iVar2 = 0x6666;
  if (pAVar1 == (AWeapon *)0x0) goto LAB_0062bca5;
  if (pAVar1 != weapon) {
    pAVar6 = (pAVar1->SisterWeapon).field_0.p;
    if (pAVar6 == (AWeapon *)0x0) {
LAB_0062bc98:
      pAVar6 = (AWeapon *)0x0;
    }
    else if (((pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
             0x20) != 0) {
      (pAVar1->SisterWeapon).field_0.p = (AWeapon *)0x0;
      goto LAB_0062bc98;
    }
    if (pAVar6 != weapon) goto LAB_0062bca5;
  }
  iVar2 = 0xd999;
LAB_0062bca5:
  FVar3 = GetInventoryIcon(&weapon->super_AInventory,0x10,(bool *)0x0);
  if (0 < FVar3.texnum) {
    tex = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
    y_00 = *y;
    h = 8;
    if (tex->Width <= tex->Height) {
      y_00 = y_00 + -8;
      *y = y_00;
      h = 0x10;
    }
    DrawImageToBox(tex,x + -0x18,y_00,0x14,h,iVar2);
    *y = *y + -10;
  }
  return;
}

Assistant:

static void DrawOneWeapon(player_t * CPlayer, int x, int & y, AWeapon * weapon)
{
	int trans;

	// Powered up weapons and inherited sister weapons are not displayed.
	if (weapon->WeaponFlags & WIF_POWERED_UP) return;
	if (weapon->SisterWeapon && weapon->IsKindOf(weapon->SisterWeapon->GetClass())) return;

	trans=0x6666;
	if (CPlayer->ReadyWeapon)
	{
		if (weapon==CPlayer->ReadyWeapon || weapon==CPlayer->ReadyWeapon->SisterWeapon) trans=0xd999;
	}

	FTextureID picnum = GetInventoryIcon(weapon, DI_ALTICONFIRST);

	if (picnum.isValid())
	{
		FTexture * tex = TexMan[picnum];
		int w = tex->GetWidth();
		int h = tex->GetHeight();
		int rh;
		if (w>h) rh=8;
		else rh=16,y-=8;		// don't draw tall sprites too small!
		DrawImageToBox(tex, x-24, y, 20, rh, trans);
		y-=10;
	}
}